

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

uint16_t gravity_function_cpool_add(gravity_vm *vm,gravity_function_t *f,gravity_value_t v)

{
  ulong uVar1;
  size_t sVar2;
  _Bool _Var3;
  _Bool _Var4;
  undefined4 in_EAX;
  void *pvVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 obj;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  gravity_value_t v2;
  undefined4 local_4c;
  
  local_4c._0_2_ = (uint16_t)in_EAX;
  obj = v.field_1;
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x20e,
                  "uint16_t gravity_function_cpool_add(gravity_vm *, gravity_function_t *, gravity_value_t)"
                 );
  }
  uVar1 = (f->field_9).field_0.cpool.n;
  bVar9 = uVar1 != 0;
  if (bVar9) {
    lVar7 = 8;
    uVar8 = 0;
    local_4c = in_EAX;
    do {
      pvVar5 = (f->field_9).field_2.special[1];
      v2.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar5 + lVar7))->n;
      v2.isa = *(gravity_class_t **)((long)pvVar5 + lVar7 + -8);
      _Var3 = gravity_value_equals(v,v2);
      if (_Var3) {
        _Var4 = gravity_value_isobject(v);
        if (_Var4) {
          gravity_object_free((gravity_vm *)0x0,obj.p);
        }
        local_4c = (undefined4)uVar8;
      }
      if (_Var3) break;
      uVar8 = uVar8 + 1;
      bVar9 = uVar8 < uVar1;
      lVar7 = lVar7 + 0x10;
    } while (uVar1 != uVar8);
  }
  if (!bVar9) {
    if ((vm != (gravity_vm *)0x0) && (_Var3 = gravity_value_isobject(v), _Var3)) {
      gravity_vm_transfer(vm,obj.p);
    }
    sVar2 = (f->field_9).field_0.cpool.m;
    if ((f->field_9).field_0.cpool.n == sVar2) {
      sVar6 = 8;
      if (sVar2 != 0) {
        sVar6 = sVar2 * 2;
      }
      (f->field_9).field_0.cpool.m = sVar6;
      pvVar5 = realloc((f->field_9).field_2.special[1],sVar6 << 4);
      (f->field_9).field_2.special[1] = pvVar5;
    }
    sVar2 = (f->field_9).field_0.cpool.n;
    pvVar5 = (f->field_9).field_2.special[1];
    (f->field_9).internal = (gravity_c_internal)(sVar2 + 1);
    lVar7 = sVar2 * 0x10;
    *(gravity_class_t **)((long)pvVar5 + lVar7) = v.isa;
    ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar5 + lVar7 + 8))->p =
         (gravity_object_t *)obj;
    local_4c._0_2_ = (short)*(undefined4 *)&f->field_9 - 1;
  }
  return (uint16_t)local_4c;
}

Assistant:

uint16_t gravity_function_cpool_add (gravity_vm *vm, gravity_function_t *f, gravity_value_t v) {
    assert(f->tag == EXEC_TYPE_NATIVE);

    size_t n = marray_size(f->cpool);
    for (size_t i=0; i<n; i++) {
        gravity_value_t v2 = marray_get(f->cpool, i);
        if (gravity_value_equals(v,v2)) {
            gravity_value_free(NULL, v);
            return (uint16_t)i;
        }
    }

    // vm is required here because I cannot know in advance if v is already in the pool or not
    // and value object v must be added to the VM only once
    if ((vm) && (gravity_value_isobject(v))) gravity_vm_transfer(vm, VALUE_AS_OBJECT(v));

    marray_push(gravity_value_t, f->cpool, v);
    return (uint16_t)marray_size(f->cpool)-1;
}